

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloat4Color
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1,GLfloat reference2,GLfloat reference3)

{
  ostringstream *this_00;
  bool bVar1;
  ulong uVar2;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  Hex<8UL> hex_02;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int local_208;
  int local_200;
  int local_1f8;
  int local_1f0;
  int local_1e8;
  StateQueryMemoryWriteGuard<int[4]> floatVector4;
  undefined1 local_1b0 [384];
  
  lVar10 = (long)((reference0 * 4.2949673e+09 + -1.0) * 0.5);
  uVar2 = lVar10 - 0x3ff;
  if (0x7ffffffe < (long)uVar2) {
    uVar2 = 0x7fffffff;
  }
  if ((long)uVar2 < -0x7fffffff) {
    uVar2 = 0xffffffff80000000;
  }
  lVar12 = (long)((reference1 * 4.2949673e+09 + -1.0) * 0.5);
  uVar4 = lVar12 - 0x3ff;
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0x7fffffff;
  }
  if ((long)uVar4 < -0x7fffffff) {
    uVar4 = 0xffffffff80000000;
  }
  lVar8 = (long)((reference2 * 4.2949673e+09 + -1.0) * 0.5);
  uVar5 = lVar8 - 0x3ff;
  if (0x7ffffffe < (long)uVar5) {
    uVar5 = 0x7fffffff;
  }
  if ((long)uVar5 < -0x7fffffff) {
    uVar5 = 0xffffffff80000000;
  }
  lVar6 = (long)((reference3 * 4.2949673e+09 + -1.0) * 0.5);
  uVar3 = lVar6 - 0x3ff;
  if (0x7ffffffe < (long)uVar3) {
    uVar3 = 0x7fffffff;
  }
  if ((long)uVar3 < -0x7fffffff) {
    uVar3 = 0xffffffff80000000;
  }
  uVar11 = lVar10 + 0x3ff;
  if (0x7ffffffe < (long)uVar11) {
    uVar11 = 0x7fffffff;
  }
  if ((long)uVar11 < -0x7fffffff) {
    uVar11 = 0xffffffff80000000;
  }
  uVar13 = lVar12 + 0x3ff;
  if (0x7ffffffe < (long)uVar13) {
    uVar13 = 0x7fffffff;
  }
  if ((long)uVar13 < -0x7fffffff) {
    uVar13 = 0xffffffff80000000;
  }
  uVar9 = lVar8 + 0x3ff;
  if (0x7ffffffe < (long)uVar9) {
    uVar9 = 0x7fffffff;
  }
  if ((long)uVar9 < -0x7fffffff) {
    uVar9 = 0xffffffff80000000;
  }
  uVar7 = lVar6 + 0x3ff;
  if (0x7ffffffe < (long)uVar7) {
    uVar7 = 0x7fffffff;
  }
  if ((long)uVar7 < -0x7fffffff) {
    uVar7 = 0xffffffff80000000;
  }
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
            (&floatVector4);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,floatVector4.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    (&floatVector4,testCtx);
  if ((bVar1) &&
     ((((local_1e8 = (int)uVar4, local_1f0 = (int)uVar5, local_1f8 = (int)uVar9,
        local_200 = (int)uVar3, local_208 = (int)uVar7,
        (int)uVar11 < floatVector4.m_value[0] || floatVector4.m_value[0] < (int)uVar2 ||
        ((int)uVar13 < floatVector4.m_value[1] || floatVector4.m_value[1] < local_1e8)) ||
       (local_1f8 < floatVector4.m_value[2] || floatVector4.m_value[2] < local_1f0)) ||
      (local_208 < floatVector4.m_value[3] || floatVector4.m_value[3] < local_200)))) {
    local_1b0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// ERROR: expected in ranges ");
    std::operator<<((ostream *)this_00,"[");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar2 & 0xffffffff));
    std::operator<<((ostream *)this_00," ");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar11 & 0xffffffff));
    std::operator<<((ostream *)this_00,"], ");
    std::operator<<((ostream *)this_00,"[");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar4 & 0xffffffff));
    std::operator<<((ostream *)this_00," ");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar13 & 0xffffffff));
    std::operator<<((ostream *)this_00,"], ");
    std::operator<<((ostream *)this_00,"[");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar5 & 0xffffffff));
    std::operator<<((ostream *)this_00," ");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar9 & 0xffffffff));
    std::operator<<((ostream *)this_00,"], ");
    std::operator<<((ostream *)this_00,"[");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar3 & 0xffffffff));
    std::operator<<((ostream *)this_00," ");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar7 & 0xffffffff));
    std::operator<<((ostream *)this_00,"]");
    std::operator<<((ostream *)this_00,"; got ");
    hex.value._4_4_ = 0;
    hex.value._0_4_ = floatVector4.m_value[0];
    tcu::Format::operator<<((ostream *)this_00,hex);
    std::operator<<((ostream *)this_00,", ");
    hex_00.value._4_4_ = 0;
    hex_00.value._0_4_ = floatVector4.m_value[1];
    tcu::Format::operator<<((ostream *)this_00,hex_00);
    std::operator<<((ostream *)this_00,", ");
    hex_01.value._4_4_ = 0;
    hex_01.value._0_4_ = floatVector4.m_value[2];
    tcu::Format::operator<<((ostream *)this_00,hex_01);
    std::operator<<((ostream *)this_00,", ");
    hex_02.value._4_4_ = 0;
    hex_02.value._0_4_ = floatVector4.m_value[3];
    tcu::Format::operator<<((ostream *)this_00,hex_02);
    std::operator<<((ostream *)this_00," ");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

GLint64 expandGLFloatToInteger (GLfloat f)
{
	const GLuint64 referenceValue = (GLint64)((f * double(0xFFFFFFFFULL) - 1) / 2);
	return referenceValue;
}